

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiskFileManager.cpp
# Opt level: O1

void __thiscall supermap::io::DiskFileManager::swap(DiskFileManager *this,path *first,path *second)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long *plVar3;
  size_type *psVar4;
  string temp_name;
  path local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pcVar2 = (first->_M_pathname)._M_dataplus._M_p;
  paVar1 = &local_70._M_pathname.field_2;
  local_70._M_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_70,pcVar2,pcVar2 + (first->_M_pathname)._M_string_length);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_70);
  psVar4 = (size_type *)(plVar3 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar3 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_48.field_2._M_allocated_capacity = *psVar4;
    local_48.field_2._8_8_ = plVar3[3];
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  }
  else {
    local_48.field_2._M_allocated_capacity = *psVar4;
    local_48._M_dataplus._M_p = (pointer)*plVar3;
  }
  local_48._M_string_length = plVar3[1];
  *plVar3 = (long)psVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_70._M_pathname._M_dataplus._M_p,
                    local_70._M_pathname.field_2._M_allocated_capacity + 1);
  }
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_70,&local_48,auto_format);
  (*(this->super_FileManager)._vptr_FileManager[3])(this,first,&local_70);
  std::filesystem::__cxx11::path::~path(&local_70);
  (*(this->super_FileManager)._vptr_FileManager[3])(this,second,first);
  std::filesystem::__cxx11::path::path<std::__cxx11::string,std::filesystem::__cxx11::path>
            (&local_70,&local_48,auto_format);
  (*(this->super_FileManager)._vptr_FileManager[3])(this,&local_70,second);
  std::filesystem::__cxx11::path::~path(&local_70);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void DiskFileManager::swap(const std::filesystem::path &first, const std::filesystem::path &second) {
    const std::string temp_name = first.string() + "-swap";
    rename(first, temp_name);
    rename(second, first);
    rename(temp_name, second);
}